

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

int wc_match_fragment(char **fragment,char **target,char *target_end)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int t_1;
  int ourchr;
  int upper;
  int lower;
  _Bool matched;
  _Bool invert;
  char *t;
  char *f;
  char *target_end_local;
  char **target_local;
  char **fragment_local;
  
  t = *fragment;
  _lower = (byte *)*target;
  do {
    bVar3 = false;
    if ((*t != '\0') && (bVar3 = false, *t != '*')) {
      bVar3 = _lower < target_end;
    }
    if (!bVar3) {
      if ((*t != '\0') && (*t != '*')) {
        return 0;
      }
      *fragment = t;
      *target = (char *)_lower;
      return 1;
    }
    if (*t == '\\') {
      if (t[1] == '\0') {
        return -1;
      }
      if (t[1] != *_lower) {
        return 0;
      }
      t = t + 2;
    }
    else {
      if (*t != '?') {
        if (*t == '[') {
          bVar3 = false;
          bVar4 = t[1] == '^';
          pcVar2 = t + 1;
          if (bVar4) {
            pcVar2 = t + 2;
          }
          while (t = pcVar2, *t != ']') {
            if (*t == '\\') {
              t = t + 1;
            }
            if (*t == '\0') {
              return -2;
            }
            if (t[1] == '-') {
              ourchr = (int)(byte)*t;
              pcVar2 = t + 2;
              if (*pcVar2 == ']') {
                return -3;
              }
              if (*pcVar2 == '\\') {
                pcVar2 = t + 3;
              }
              t = pcVar2;
              if (*t == '\0') {
                return -2;
              }
              uVar1 = (uint)(byte)*t;
              t_1 = uVar1;
              if (uVar1 < (uint)ourchr) {
                t_1 = ourchr;
                ourchr = uVar1;
              }
              if (((uint)ourchr <= (uint)*_lower) && ((uint)*_lower <= (uint)t_1)) {
                bVar3 = true;
              }
            }
            else {
              bVar3 = bVar3 || *_lower == *t;
            }
            t = t + 1;
            pcVar2 = t;
          }
          if (bVar4 == bVar3) {
            return 0;
          }
        }
        else if (*t != *_lower) {
          return 0;
        }
      }
      t = t + 1;
    }
    _lower = _lower + 1;
  } while( true );
}

Assistant:

static int wc_match_fragment(const char **fragment, const char **target,
                             const char *target_end)
{
    const char *f, *t;

    f = *fragment;
    t = *target;
    /*
     * The fragment terminates at either the end of the string, or
     * the first (unescaped) *.
     */
    while (*f && *f != '*' && t < target_end) {
        /*
         * Extract one character from t, and one character's worth
         * of pattern from f, and step along both. Return 0 if they
         * fail to match.
         */
        if (*f == '\\') {
            /*
             * Backslash, which means f[1] is to be treated as a
             * literal character no matter what it is. It may not
             * be the end of the string.
             */
            if (!f[1])
                return -WC_TRAILINGBACKSLASH;   /* error */
            if (f[1] != *t)
                return 0;              /* failed to match */
            f += 2;
        } else if (*f == '?') {
            /*
             * Question mark matches anything.
             */
            f++;
        } else if (*f == '[') {
            bool invert = false;
            bool matched = false;
            /*
             * Open bracket introduces a character class.
             */
            f++;
            if (*f == '^') {
                invert = true;
                f++;
            }
            while (*f != ']') {
                if (*f == '\\')
                    f++;               /* backslashes still work */
                if (!*f)
                    return -WC_UNCLOSEDCLASS;   /* error again */
                if (f[1] == '-') {
                    int lower, upper, ourchr;
                    lower = (unsigned char) *f++;
                    f++;               /* eat the minus */
                    if (*f == ']')
                        return -WC_INVALIDRANGE;   /* different error! */
                    if (*f == '\\')
                        f++;           /* backslashes _still_ work */
                    if (!*f)
                        return -WC_UNCLOSEDCLASS;   /* error again */
                    upper = (unsigned char) *f++;
                    ourchr = (unsigned char) *t;
                    if (lower > upper) {
                        int t = lower; lower = upper; upper = t;
                    }
                    if (ourchr >= lower && ourchr <= upper)
                        matched = true;
                } else {
                    matched |= (*t == *f++);
                }
            }
            if (invert == matched)
                return 0;              /* failed to match character class */
            f++;                       /* eat the ] */
        } else {
            /*
             * Non-special character matches itself.
             */
            if (*f != *t)
                return 0;
            f++;
        }
        /*
         * Now we've done that, increment t past the character we
         * matched.
         */
        t++;
    }
    if (!*f || *f == '*') {
        /*
         * We have reached the end of f without finding a mismatch;
         * so we're done. Update the caller pointers and return 1.
         */
        *fragment = f;
        *target = t;
        return 1;
    }
    /*
     * Otherwise, we must have reached the end of t before we
     * reached the end of f; so we've failed. Return 0.
     */
    return 0;
}